

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O3

void __thiscall ipx::BasicLu::BasicLu(BasicLu *this,Control *control,Int dim)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer pdVar1;
  lu_int lVar2;
  logic_error *this_01;
  size_type __new_size;
  
  (this->super_LuUpdate).updates_ = 0;
  (this->super_LuUpdate)._vptr_LuUpdate = (_func_int **)&PTR__BasicLu_00441738;
  this->control_ = control;
  this_00 = &this->istore_;
  __new_size = (size_type)(dim * 0x15 + 0x400);
  memset(this_00,0,0xc0);
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->xstore_,__new_size);
  lVar2 = basiclu_initialize(dim,(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start,
                             (this->xstore_).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  if (lVar2 == 0) {
    std::vector<int,_std::allocator<int>_>::resize(&this->Li_,1);
    std::vector<double,_std::allocator<double>_>::resize(&this->Lx_,1);
    std::vector<int,_std::allocator<int>_>::resize(&this->Ui_,1);
    std::vector<double,_std::allocator<double>_>::resize(&this->Ux_,1);
    std::vector<int,_std::allocator<int>_>::resize(&this->Wi_,1);
    std::vector<double,_std::allocator<double>_>::resize(&this->Wx_,1);
    pdVar1 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1[1] = 1.0;
    pdVar1[2] = 1.0;
    pdVar1[3] = 1.0;
    this->fill_factor_ = 0.0;
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"basiclu_initialize failed");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BasicLu::BasicLu(const Control& control, Int dim) : control_(control) {
    static_assert(sizeof(Int) == sizeof(lu_int),
                  "IPX integer type does not match BASICLU integer type");
    istore_.resize(BASICLU_SIZE_ISTORE_1 + BASICLU_SIZE_ISTORE_M * dim);
    xstore_.resize(BASICLU_SIZE_ISTORE_1 + BASICLU_SIZE_ISTORE_M * dim);

    Int status = basiclu_initialize(dim, istore_.data(), xstore_.data());
    if (status != BASICLU_OK)
        throw std::logic_error("basiclu_initialize failed");

    // Set initial size of BASICLU work arrays to 1 element, so that data()
    // does not return NULL (not sure if it would if size is 0).
    Li_.resize(1);
    Lx_.resize(1);
    Ui_.resize(1);
    Ux_.resize(1);
    Wi_.resize(1);
    Wx_.resize(1);
    xstore_[BASICLU_MEMORYL] = 1;
    xstore_[BASICLU_MEMORYU] = 1;
    xstore_[BASICLU_MEMORYW] = 1;
    fill_factor_ = 0.0;
}